

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall
Catch::ReporterRegistry::registerReporter
          (ReporterRegistry *this,string *name,IReporterFactoryPtr *factory)

{
  long lVar1;
  long *plVar2;
  size_type *psVar3;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>,_bool>
  pVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  ReusableStringStream local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  lVar1 = std::__cxx11::string::find((char *)name,0x17a889,0);
  if (lVar1 != -1) {
    ReusableStringStream::ReusableStringStream(&local_68);
    std::operator+(&local_58,"\'::\' is not allowed in reporter name: \'",name);
    std::operator+(&local_88,&local_58,'\'');
    std::__ostream_insert<char,std::char_traits<char>>
              (local_68.m_oss,local_88._M_dataplus._M_p,local_88._M_string_length);
    std::__cxx11::stringbuf::str();
    throw_domain_error(&local_38);
  }
  pVar4 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::Detail::unique_ptr<Catch::IReporterFactory>>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::Detail::unique_ptr<Catch::IReporterFactory>>>,Catch::Detail::CaseInsensitiveLess,std::allocator<std::pair<std::__cxx11::string_const,Catch::Detail::unique_ptr<Catch::IReporterFactory>>>>
          ::
          _M_emplace_unique<std::__cxx11::string_const&,Catch::Detail::unique_ptr<Catch::IReporterFactory>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::Detail::unique_ptr<Catch::IReporterFactory>>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::Detail::unique_ptr<Catch::IReporterFactory>>>,Catch::Detail::CaseInsensitiveLess,std::allocator<std::pair<std::__cxx11::string_const,Catch::Detail::unique_ptr<Catch::IReporterFactory>>>>
                      *)&((this->m_impl).m_ptr)->factories,name,factory);
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    return;
  }
  ReusableStringStream::ReusableStringStream(&local_68);
  std::operator+(&local_58,"reporter using \'",name);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_58);
  local_88._M_dataplus._M_p = (pointer)*plVar2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_88._M_dataplus._M_p == psVar3) {
    local_88.field_2._M_allocated_capacity = *psVar3;
    local_88.field_2._8_8_ = plVar2[3];
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  }
  else {
    local_88.field_2._M_allocated_capacity = *psVar3;
  }
  local_88._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__ostream_insert<char,std::char_traits<char>>
            (local_68.m_oss,local_88._M_dataplus._M_p,local_88._M_string_length);
  std::__cxx11::stringbuf::str();
  throw_domain_error(&local_38);
}

Assistant:

void ReporterRegistry::registerReporter( std::string const& name,
                                             IReporterFactoryPtr factory ) {
        CATCH_ENFORCE( name.find( "::" ) == name.npos,
                       "'::' is not allowed in reporter name: '" + name +
                           '\'' );
        auto ret = m_impl->factories.emplace( name, CATCH_MOVE( factory ) );
        CATCH_ENFORCE( ret.second,
                       "reporter using '" + name +
                           "' as name was already registered" );
    }